

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_9::DiskDirectory::trySymlink
          (DiskDirectory *this,PathPtr linkpath,StringPtr content,WriteMode mode)

{
  bool bVar1;
  Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t> local_48;
  _func_int *local_38;
  size_t local_30;
  
  local_30 = content.content.size_;
  local_38 = (_func_int *)content.content.ptr;
  local_48.ptr = (Iface *)operator_new(0x18);
  (local_48.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0059ea38;
  local_48.ptr[1]._vptr_Iface = &local_38;
  local_48.ptr[2]._vptr_Iface = (_func_int **)&this->super_DiskHandle;
  local_48.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::trySymlink(kj::PathPtr,kj::StringPtr,kj::WriteMode)const::{lambda(kj::StringPtr)#1}>>
        ::instance;
  bVar1 = DiskHandle::tryReplaceNode
                    (&this->super_DiskHandle,linkpath,mode,
                     (Function<int_(kj::StringPtr)> *)&local_48);
  Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose(&local_48);
  return bVar1;
}

Assistant:

bool trySymlink(PathPtr linkpath, StringPtr content, WriteMode mode) const override {
    return DiskHandle::trySymlink(linkpath, content, mode);
  }